

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O3

DecimalQuantity * __thiscall
icu_63::number::impl::DecimalQuantity::operator=(DecimalQuantity *this,DecimalQuantity *other)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  
  if (this != other) {
    copyBcdFrom(this,other);
    this->bogus = other->bogus;
    iVar1 = other->lReqPos;
    iVar2 = other->rReqPos;
    iVar3 = other->rOptPos;
    this->lOptPos = other->lOptPos;
    this->lReqPos = iVar1;
    this->rReqPos = iVar2;
    this->rOptPos = iVar3;
    iVar1 = other->precision;
    this->scale = other->scale;
    this->precision = iVar1;
    this->flags = other->flags;
    this->origDouble = other->origDouble;
    this->origDelta = other->origDelta;
    this->isApproximate = other->isApproximate;
  }
  return this;
}

Assistant:

DecimalQuantity &DecimalQuantity::operator=(const DecimalQuantity &other) {
    if (this == &other) {
        return *this;
    }
    copyBcdFrom(other);
    copyFieldsFrom(other);
    return *this;
}